

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O3

uint GetAccessSize(VmInstruction *inst)

{
  VmValue *pVVar1;
  uint uVar2;
  
  switch(inst->cmd) {
  case VM_INST_LOAD_BYTE:
  case VM_INST_STORE_BYTE:
    uVar2 = 1;
    break;
  case VM_INST_LOAD_SHORT:
  case VM_INST_STORE_SHORT:
    uVar2 = 2;
    break;
  case VM_INST_LOAD_INT:
  case VM_INST_LOAD_FLOAT:
  case VM_INST_STORE_INT:
  case VM_INST_STORE_FLOAT:
    uVar2 = 4;
    break;
  case VM_INST_LOAD_DOUBLE:
  case VM_INST_LOAD_LONG:
  case VM_INST_STORE_DOUBLE:
  case VM_INST_STORE_LONG:
    uVar2 = 8;
    break;
  case VM_INST_LOAD_STRUCT:
    uVar2 = (inst->super_VmValue).type.size;
    break;
  default:
    __assert_fail("!\"unknown access instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                  ,0x119,"unsigned int GetAccessSize(VmInstruction *)");
  case VM_INST_STORE_STRUCT:
    if ((inst->arguments).count < 3) {
LAB_001bb108:
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    uVar2 = ((inst->arguments).data[2]->type).size;
    break;
  case VM_INST_MEM_COPY:
    if ((inst->arguments).count < 5) goto LAB_001bb108;
    pVVar1 = (inst->arguments).data[4];
    if ((pVVar1 == (VmValue *)0x0) || (pVVar1->typeID != 1)) {
      __assert_fail("!\"invalid memcopy instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                    ,0xf3,"unsigned int GetAccessSize(VmInstruction *)");
    }
    uVar2 = *(uint *)&pVVar1[1]._vptr_VmValue;
    break;
  case VM_INST_ADD_LOAD:
  case VM_INST_SUB_LOAD:
  case VM_INST_MUL_LOAD:
  case VM_INST_DIV_LOAD:
  case VM_INST_POW_LOAD:
  case VM_INST_MOD_LOAD:
  case VM_INST_LESS_LOAD:
  case VM_INST_GREATER_LOAD:
  case VM_INST_LESS_EQUAL_LOAD:
  case VM_INST_GREATER_EQUAL_LOAD:
  case VM_INST_EQUAL_LOAD:
  case VM_INST_NOT_EQUAL_LOAD:
  case VM_INST_SHL_LOAD:
  case VM_INST_SHR_LOAD:
  case VM_INST_BIT_AND_LOAD:
  case VM_INST_BIT_OR_LOAD:
  case VM_INST_BIT_XOR_LOAD:
    if ((inst->arguments).count < 4) goto LAB_001bb108;
    pVVar1 = (inst->arguments).data[3];
    if (((pVVar1 == (VmValue *)0x0) || (pVVar1->typeID != 1)) ||
       (uVar2 = *(int *)&pVVar1[1]._vptr_VmValue - 2, 3 < uVar2)) {
      __assert_fail("!\"unknown load type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                    ,0x113,"unsigned int GetAccessSize(VmInstruction *)");
    }
    uVar2 = *(uint *)(&DAT_002089a4 + (ulong)uVar2 * 4);
  }
  return uVar2;
}

Assistant:

unsigned GetAccessSize(VmInstruction *inst)
{
	switch(inst->cmd)
	{
	case VM_INST_LOAD_BYTE:
		return 1;
	case VM_INST_LOAD_SHORT:
		return 2;
	case VM_INST_LOAD_INT:
		return 4;
	case VM_INST_LOAD_FLOAT:
		return 4;
	case VM_INST_LOAD_DOUBLE:
		return 8;
	case VM_INST_LOAD_LONG:
		return 8;
	case VM_INST_LOAD_STRUCT:
		return inst->type.size;
	case VM_INST_STORE_BYTE:
		return 1;
	case VM_INST_STORE_SHORT:
		return 2;
	case VM_INST_STORE_INT:
		return 4;
	case VM_INST_STORE_FLOAT:
		return 4;
	case VM_INST_STORE_DOUBLE:
		return 8;
	case VM_INST_STORE_LONG:
		return 8;
	case VM_INST_STORE_STRUCT:
		return inst->arguments[2]->type.size;
	case VM_INST_MEM_COPY:
		if(VmConstant *size = getType<VmConstant>(inst->arguments[4]))
			return size->iValue;

		assert(!"invalid memcopy instruction");
		break;
	case VM_INST_ADD_LOAD:
	case VM_INST_SUB_LOAD:
	case VM_INST_MUL_LOAD:
	case VM_INST_DIV_LOAD:
	case VM_INST_POW_LOAD:
	case VM_INST_MOD_LOAD:
	case VM_INST_LESS_LOAD:
	case VM_INST_GREATER_LOAD:
	case VM_INST_LESS_EQUAL_LOAD:
	case VM_INST_GREATER_EQUAL_LOAD:
	case VM_INST_EQUAL_LOAD:
	case VM_INST_NOT_EQUAL_LOAD:
	case VM_INST_SHL_LOAD:
	case VM_INST_SHR_LOAD:
	case VM_INST_BIT_AND_LOAD:
	case VM_INST_BIT_OR_LOAD:
	case VM_INST_BIT_XOR_LOAD:
		if(VmConstant *loadInst = getType<VmConstant>(inst->arguments[3]))
		{
			switch(loadInst->iValue)
			{
			case VM_INST_LOAD_INT:
			case VM_INST_LOAD_FLOAT:
				return 4;
			case VM_INST_LOAD_DOUBLE:
			case VM_INST_LOAD_LONG:
				return 8;
			}
		}

		assert(!"unknown load type");
		break;
	default:
		break;
	}

	assert(!"unknown access instruction");
	return 0;
}